

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O1

void msd_lsd_adaptive<6u>(Cacheblock<6U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  bool bVar2;
  uchar *puVar3;
  void *__src;
  long lVar4;
  Cacheblock<6U> *pCVar5;
  ulong uVar6;
  size_t sVar7;
  ushort uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uchar *puVar12;
  long alStack_80038 [65537];
  
  while( true ) {
    if (N < 0x10000) {
      msd_lsd<6u>(cache,N,depth);
      return;
    }
    fill_cache<6u>(cache,N,depth);
    puVar12 = (cache->chars)._M_elems + 5;
    uVar10 = 5;
    do {
      memset(alStack_80038,0,0x80000);
      puVar3 = puVar12;
      uVar6 = N;
      do {
        alStack_80038[(ushort)(*(ushort *)(puVar3 + -1) << 8 | *(ushort *)(puVar3 + -1) >> 8)] =
             alStack_80038[(ushort)(*(ushort *)(puVar3 + -1) << 8 | *(ushort *)(puVar3 + -1) >> 8)]
             + 1;
        puVar3 = puVar3 + 0x10;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      __src = malloc(N << 4);
      msd_lsd_adaptive<6U>::bucketindex[0] = 0;
      lVar4 = 0;
      sVar7 = 0;
      do {
        sVar7 = sVar7 + alStack_80038[lVar4];
        msd_lsd_adaptive<6U>::bucketindex[lVar4 + 1] = sVar7;
        lVar4 = lVar4 + 1;
        pCVar5 = cache;
        uVar6 = N;
      } while (lVar4 != 0xffff);
      do {
        uVar8 = *(ushort *)((pCVar5->chars)._M_elems + (uVar10 - 1));
        uVar8 = uVar8 << 8 | uVar8 >> 8;
        sVar7 = msd_lsd_adaptive<6U>::bucketindex[uVar8];
        msd_lsd_adaptive<6U>::bucketindex[uVar8] = sVar7 + 1;
        puVar3 = pCVar5->ptr;
        puVar1 = (undefined8 *)((long)__src + sVar7 * 0x10);
        *puVar1 = *(undefined8 *)pCVar5;
        puVar1[1] = puVar3;
        uVar6 = uVar6 - 1;
        pCVar5 = pCVar5 + 1;
      } while (uVar6 != 0);
      memcpy(cache,__src,N << 4);
      free(__src);
      puVar12 = puVar12 + -2;
      bVar2 = 2 < uVar10;
      uVar10 = uVar10 - 2;
    } while (bVar2);
    if (N == 1) {
      uVar6 = 1;
      uVar10 = 0;
    }
    else {
      uVar11 = 1;
      sVar7 = 1;
      uVar9 = 0;
      pCVar5 = cache;
      do {
        if (*(short *)((pCVar5->chars)._M_elems + 4) == *(short *)(pCVar5[1].chars._M_elems + 4) &&
            *(int *)(pCVar5->chars)._M_elems == *(int *)pCVar5[1].chars._M_elems) {
          uVar6 = sVar7 + 1;
          uVar10 = uVar9;
        }
        else {
          uVar6 = 1;
          uVar10 = uVar11;
          if ((1 < sVar7) && (cache[uVar9].chars._M_elems[5] != '\0')) {
            msd_lsd_adaptive<6u>(cache + uVar9,sVar7,depth + 6);
          }
        }
        uVar11 = uVar11 + 1;
        pCVar5 = pCVar5 + 1;
        sVar7 = uVar6;
        uVar9 = uVar10;
      } while (N != uVar11);
    }
    if ((uVar6 < 2) || (cache[uVar10].chars._M_elems[5] == '\0')) break;
    cache = cache + uVar10;
    depth = depth + 6;
    N = uVar6;
  }
  return;
}

Assistant:

static void
msd_lsd_adaptive(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars%2==0, "CachedChars%2==0");
	static_assert(CachedChars>=2,   "CachedChars>=2");
	if (N < 0x10000) {
		msd_lsd(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte > 0; byte -= 2) {
		size_t bucketsize[0x10000] = {0};
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			++bucketsize[bucket];
		}
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		static size_t bucketindex[0x10000];
		bucketindex[0] = 0;
		for (size_t i=1; i < 0x10000; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			memcpy(&sorted[bucketindex[bucket]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		}
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
	}
}